

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  uint uVar1;
  Bitset *pBVar2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  CompilerError *this_00;
  allocator local_49;
  string local_48;
  
  pBVar2 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)id);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if ((pSVar3 != (SPIRVariable *)0x0) &&
     ((pSVar3->storage == StorageClassTaskPayloadWorkgroupEXT ||
      ((pSVar3->storage == StorageClassWorkgroup && ((this->backend).shared_is_implied == false)))))
     ) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x32])(&local_48,this,pBVar2);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_48);
  if (pSVar3 != (SPIRVariable *)0x0) {
    (*(this->super_Compiler)._vptr_Compiler[0x30])(this,pSVar3);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pSVar4 = Compiler::expression_type(&this->super_Compiler,id);
  if (((pSVar4->image).dim != DimSubpassData) && ((pSVar4->image).sampled == 2)) {
    uVar1 = (uint)pBVar2->lower;
    if ((uVar1 >> 0x17 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar1 = (uint)pBVar2->lower;
    }
    if ((uVar1 >> 0x13 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar1 = (uint)pBVar2->lower;
    }
    if ((uVar1 >> 0x18 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar1 = (uint)pBVar2->lower;
    }
    if ((uVar1 >> 0x19 & 1) == 0) {
      if ((pSVar4->image).format == ImageFormatUnknown) {
        if ((this->options).es != false) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_48,"Cannot use GL_EXT_shader_image_load_formatted in ESSL.",
                     &local_49);
          CompilerError::CompilerError(this_00,&local_48);
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string
                  ((string *)&local_48,"GL_EXT_shader_image_load_formatted",&local_49);
        require_extension_internal(this,&local_48);
        ::std::__cxx11::string::~string((string *)&local_48);
      }
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  to_precision_qualifiers_glsl_abi_cxx11_(&local_48,this,id);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_qualifiers_glsl(uint32_t id)
{
	auto &flags = get_decoration_bitset(id);
	string res;

	auto *var = maybe_get<SPIRVariable>(id);

	if (var && var->storage == StorageClassWorkgroup && !backend.shared_is_implied)
		res += "shared ";
	else if (var && var->storage == StorageClassTaskPayloadWorkgroupEXT)
		res += "taskPayloadSharedEXT ";

	res += to_interpolation_qualifiers(flags);
	if (var)
		res += to_storage_qualifiers_glsl(*var);

	auto &type = expression_type(id);
	if (type.image.dim != DimSubpassData && type.image.sampled == 2)
	{
		if (flags.get(DecorationCoherent))
			res += "coherent ";
		if (flags.get(DecorationRestrict))
			res += "restrict ";

		if (flags.get(DecorationNonWritable))
			res += "readonly ";

		bool formatted_load = type.image.format == ImageFormatUnknown;
		if (flags.get(DecorationNonReadable))
		{
			res += "writeonly ";
			formatted_load = false;
		}

		if (formatted_load)
		{
			if (!options.es)
				require_extension_internal("GL_EXT_shader_image_load_formatted");
			else
				SPIRV_CROSS_THROW("Cannot use GL_EXT_shader_image_load_formatted in ESSL.");
		}
	}

	res += to_precision_qualifiers_glsl(id);

	return res;
}